

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O0

bool TestCompressionF<Counter<unsigned_int,32u>,Counter<unsigned_char,8u>>(int bias)

{
  Counter<unsigned_char,_8U> local_141;
  Counter<unsigned_int,_32U> local_140;
  Counter<unsigned_int,_32U> local_13c;
  Counter<unsigned_char,_8U> local_135;
  Counter<unsigned_int,_32U> local_134;
  Counter<unsigned_int,_32U> local_130;
  int local_12c;
  Counter<unsigned_int,_32U> expanded;
  int delta_1;
  int delta;
  uint uStack_11c;
  Counter<unsigned_char,_8U> truncatedRecent;
  Counter<unsigned_int,_32U> fullRecent;
  uint recent;
  uint uStack_110;
  Counter<unsigned_char,_8U> truncatedOriginal;
  Counter<unsigned_int,_32U> fullOriginal;
  uint original;
  uint range;
  int bias_local;
  Counter<unsigned_int,_32U> local_c0;
  uint local_bc;
  Counter<unsigned_int,_32U> local_b8;
  uint absDiff_1;
  uint local_b0;
  uint absDiff;
  uint recentLow;
  Counter<unsigned_int,_32U> *local_a0;
  Counter<unsigned_int,_32U> *local_98;
  ThisType *result;
  Counter<unsigned_int,_32U> *local_88;
  Counter<unsigned_char,_8U> *local_80;
  Counter<unsigned_char,_8U> *local_78;
  Counter<unsigned_char,_8U> *local_70;
  Counter<unsigned_char,_8U> *local_68;
  Counter<unsigned_int,_32U> *local_60;
  Counter<unsigned_int,_32U> *local_58;
  Counter<unsigned_int,_32U> *local_50;
  Counter<unsigned_int,_32U> *local_48;
  Counter<unsigned_int,_32U> local_40;
  char local_39;
  Counter<unsigned_char,_8U> *pCStack_38;
  int8_t gap;
  Counter<unsigned_int,_32U> *local_30;
  Counter<unsigned_int,_32U> *local_28;
  Counter<unsigned_int,_32U> *local_20;
  Counter<unsigned_int,_32U> *local_18;
  Counter<unsigned_int,_32U> *local_10;
  
  uStack_110 = 0;
  do {
    if (0x1ff < uStack_110) {
      return true;
    }
    Counter<unsigned_int,_32U>::Counter((Counter<unsigned_int,_32U> *)&recent,uStack_110);
    Counter<unsigned_char,_8U>::Counter
              ((Counter<unsigned_char,_8U> *)((long)&fullRecent.Value + 3),'\0');
    Counter<unsigned_char,_8U>::operator=
              ((Counter<unsigned_char,_8U> *)((long)&fullRecent.Value + 3),(uchar)recent);
    for (uStack_11c = 0; uStack_11c < 0x200; uStack_11c = uStack_11c + 1) {
      Counter<unsigned_int,_32U>::Counter((Counter<unsigned_int,_32U> *)&delta,uStack_11c);
      Counter<unsigned_char,_8U>::Counter((Counter<unsigned_char,_8U> *)((long)&delta_1 + 3),'\0');
      Counter<unsigned_char,_8U>::operator=
                ((Counter<unsigned_char,_8U> *)((long)&delta_1 + 3),(uchar)delta);
      if (uStack_11c < uStack_110) {
        expanded.Value = uStack_110 - uStack_11c;
        if ((int)expanded.Value < 0x80 - bias) {
LAB_00113182:
          Counter<unsigned_int,_32U>::Counter(&local_134,(ThisType *)&delta);
          Counter<unsigned_char,_8U>::Counter(&local_135,(ThisType *)((long)&fullRecent.Value + 3));
          local_98 = &local_130;
          local_a0 = &local_134;
          _recentLow = &local_135;
          local_68 = &local_135;
          local_58 = &local_134;
          absDiff = bias;
          Counter<unsigned_int,_32U>::Counter
                    (&local_130,(uint)local_135.Value | local_134.Value & 0xffffff00);
          local_60 = &local_134;
          local_b0 = local_134.Value & 0xff;
          local_70 = &local_135;
          if (local_b0 < local_135.Value) {
            local_78 = &local_135;
            absDiff_1 = local_135.Value - local_b0;
            if (0x80 - absDiff <= absDiff_1) {
              Counter<unsigned_int,_32U>::Counter(&local_b8,0x100);
              local_48 = &local_130;
              local_50 = &local_b8;
              local_130.Value = local_130.Value - local_b8.Value;
            }
          }
          else {
            local_80 = &local_135;
            local_bc = local_b0 - local_135.Value;
            if (absDiff + 0x80 < local_bc) {
              Counter<unsigned_int,_32U>::Counter(&local_c0,0x100);
              local_88 = &local_130;
              result = &local_c0;
              local_130.Value = local_130.Value + local_c0.Value;
            }
          }
          if (local_130.Value != recent) {
            return false;
          }
          if (bias == 0) {
            Counter<unsigned_int,_32U>::Counter(&local_140,(ThisType *)&delta);
            Counter<unsigned_char,_8U>::Counter
                      (&local_141,(ThisType *)((long)&fullRecent.Value + 3));
            local_28 = &local_13c;
            local_30 = &local_140;
            pCStack_38 = &local_141;
            local_39 = local_141.Value - (char)local_140.Value;
            Counter<unsigned_int,_32U>::Counter(&local_40,(int)local_39);
            local_10 = &local_13c;
            local_18 = &local_140;
            local_20 = &local_40;
            Counter<unsigned_int,_32U>::Counter(&local_13c,local_140.Value + local_40.Value);
            Counter<unsigned_int,_32U>::operator=(&local_130,&local_13c);
            if (local_130.Value != recent) {
              return false;
            }
          }
        }
      }
      else {
        local_12c = uStack_11c - uStack_110;
        if (local_12c <= bias + 0x80) goto LAB_00113182;
      }
    }
    uStack_110 = uStack_110 + 1;
  } while( true );
}

Assistant:

bool TestCompressionF(int bias)
{
    const unsigned range = SmallerT::kMSB << 2;

    for (unsigned original = 0; original < range; ++original)
    {
        LargerT fullOriginal = original;
        SmallerT truncatedOriginal;
        fullOriginal.TruncateTo(truncatedOriginal);

        for (unsigned recent = 0; recent < range; ++recent)
        {
            LargerT fullRecent = recent;
            SmallerT truncatedRecent;
            fullRecent.TruncateTo(truncatedRecent);

            // Skip cases we cannot handle
            if (recent < original)
            {
                int delta = original - recent;
                if (delta >= SmallerT::kMSB - bias)
                    continue;
            }
            else
            {
                int delta = recent - original;
                if (delta > SmallerT::kMSB + bias)
                    continue;
            }

#if 0
            // Useful for debugging
            int changeNeeded = (int)((fullOriginal.Get() >> Counter4::kBits) - (fullRecent.Get() >> Counter4::kBits));
            if (changeNeeded != 0)
            {
                std::cout << "orig=" << (int)fullOriginal.Get();
                std::cout << ", recent=" << (int)fullRecent.Get();
                std::cout << ", (T)orig=" << (int)truncatedOriginal.Get();
                std::cout << ", (T)recent=" << (int)truncatedRecent.Get();
                std::cout << ", delta=" << (int)(truncatedRecent.Get() - truncatedOriginal.Get());
                std::cout << ", Expected=" << changeNeeded;
                std::cout << std::endl;
            }
#endif

            LargerT expanded = LargerT::ExpandFromTruncatedWithBias(fullRecent, truncatedOriginal, bias);
            TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());

            if (bias == 0)
            {
                expanded = LargerT::ExpandFromTruncated(fullRecent, truncatedOriginal);
                TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());
            }
        }
    }

    return true;
}